

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::CopyNodes
          (TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *this,Node *nodes,
          hash_t numnodes)

{
  undefined8 in_RAX;
  Node *pNVar1;
  double *pdVar2;
  undefined8 uStack_28;
  
  if (numnodes != 0) {
    pdVar2 = &(nodes->Pair).Value;
    uStack_28 = in_RAX;
    do {
      if (pdVar2[-2] != 4.94065645841247e-324) {
        uStack_28 = CONCAT44((((IPair *)(pdVar2 + -1))->Key).Index,(undefined4)uStack_28);
        pNVar1 = NewKey(this,(FName *)((long)&uStack_28 + 4));
        (pNVar1->Pair).Value = *pdVar2;
      }
      numnodes = numnodes - 1;
      pdVar2 = pdVar2 + 3;
    } while (numnodes != 0);
  }
  return;
}

Assistant:

void CopyNodes(const Node *nodes, hash_t numnodes)
	{
		for (; numnodes-- > 0; ++nodes)
		{
			if (!nodes->IsNil())
			{
				Node *n = NewKey(nodes->Pair.Key);
				::new(&n->Pair.Value) VT(nodes->Pair.Value);
			}
		}
	}